

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::VarExtend::to_string_abi_cxx11_(string *__return_storage_ptr__,VarExtend *this)

{
  uint uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view format_str;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_48 [2];
  undefined8 local_38;
  undefined8 uStack_30;
  
  uVar1 = (*(this->super_Expr).super_Var.super_IRNode._vptr_IRNode[7])(this);
  (*(this->parent_->super_IRNode)._vptr_IRNode[0x1f])(&local_68);
  local_48[0] = (ulong)uVar1;
  local_38 = local_68;
  uStack_30 = uStack_60;
  bVar2 = fmt::v7::to_string_view<char,_0>("{0}\'({1})");
  format_str.data_ = (char *)bVar2.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_48;
  format_str.size_ = 0xd2;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)bVar2.data_,format_str,args);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string VarExtend::to_string() const {
    return ::format("{0}'({1})", width(), parent_->to_string());
}